

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O3

shared_ptr<kratos::InterfaceModPortDefinition> __thiscall
kratos::InterfaceDefinition::create_modport_def(InterfaceDefinition *this,string *name)

{
  iterator iVar1;
  UserException *this_00;
  key_type *in_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>,_bool>
  pVar2;
  shared_ptr<kratos::InterfaceModPortDefinition> sVar3;
  string_view format_str;
  format_args args;
  pointer local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  undefined8 local_68;
  pointer pcStack_60;
  string local_50;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
                  *)(name[4].field_2._M_local_buf + 8),in_RDX);
  if (iVar1._M_node == (_Base_ptr)(name + 5)) {
    std::__shared_ptr<kratos::InterfaceDefinition,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::InterfaceDefinition,void>
              ((__shared_ptr<kratos::InterfaceDefinition,(__gnu_cxx::_Lock_policy)2> *)&local_78,
               (__weak_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2> *)
               &name->_M_string_length);
    (this->super_IDefinition)._vptr_IDefinition = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<kratos::InterfaceModPortDefinition,std::allocator<kratos::InterfaceModPortDefinition>,std::shared_ptr<kratos::InterfaceDefinition>,std::__cxx11::string_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<kratos::InterfaceDefinition>,
               (InterfaceModPortDefinition **)this,
               (allocator<kratos::InterfaceModPortDefinition> *)&local_50,
               (shared_ptr<kratos::InterfaceDefinition> *)&local_78,in_RDX);
    if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
    }
    pVar2 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceModPortDefinition>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceModPortDefinition>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceModPortDefinition>>>>
            ::
            _M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::InterfaceModPortDefinition>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceModPortDefinition>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceModPortDefinition>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceModPortDefinition>>>>
                        *)(name[4].field_2._M_local_buf + 8),in_RDX,
                       (shared_ptr<kratos::InterfaceModPortDefinition> *)this);
    sVar3.super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = pVar2._8_8_;
    sVar3.super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)this;
    return (shared_ptr<kratos::InterfaceModPortDefinition>)
           sVar3.super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_78 = (in_RDX->_M_dataplus)._M_p;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX->_M_string_length;
  local_68 = *(undefined8 *)((long)&name->field_2 + 8);
  pcStack_60 = name[1]._M_dataplus._M_p;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x19;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  fmt::v7::detail::vformat_abi_cxx11_(&local_50,(detail *)0x24164e,format_str,args);
  UserException::UserException(this_00,&local_50);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<InterfaceModPortDefinition> InterfaceDefinition::create_modport_def(
    const std::string& name) {
    if (mod_ports_.find(name) != mod_ports_.end())
        throw UserException(::format("{0} already exists in {1}", name, name_));
    auto p = std::make_shared<InterfaceModPortDefinition>(shared_from_this(), name);
    mod_ports_.emplace(name, p);
    return p;
}